

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O2

Tree vmergetree(Tree t1,Tree t2)

{
  int iVar1;
  int iVar2;
  Branch *pBVar3;
  int iVar4;
  Branch *pBVar5;
  int iVar6;
  uint uVar7;
  Branch *pBVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  Tree TVar17;
  int local_38;
  
  pBVar5 = t2.branch;
  pBVar8 = t1.branch;
  iVar4 = t2.deg;
  iVar9 = t1.deg;
  iVar15 = iVar4 + iVar9;
  TVar17.deg = iVar4 + iVar9 + -1;
  pBVar3 = (Branch *)malloc((long)(iVar15 * 2 + -4) * 0xc);
  iVar4 = iVar4 + -1;
  uVar7 = iVar9 - 1;
  lVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar7) {
    uVar11 = (ulong)uVar7;
  }
  for (; uVar11 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
    *(undefined8 *)((long)&pBVar3->x + lVar10) = *(undefined8 *)((long)&pBVar8->x + lVar10);
    *(int *)((long)&pBVar3->n + lVar10) = *(int *)((long)&pBVar8->n + lVar10) + iVar4;
  }
  iVar1 = iVar9 * 2 + -3;
  lVar10 = (long)iVar9;
  lVar14 = 0;
  for (lVar12 = lVar10 + -1; lVar12 <= iVar15 + -2; lVar12 = lVar12 + 1) {
    *(undefined8 *)((long)&pBVar3[lVar10 + -1].x + lVar14) =
         *(undefined8 *)((long)&pBVar5->x + lVar14);
    *(int *)((long)pBVar3 + lVar14 + lVar10 * 0xc + -4) =
         *(int *)((long)&pBVar5->n + lVar14) + iVar1;
    lVar14 = lVar14 + 0xc;
  }
  local_38 = t1.length;
  local_38 = t2.length + local_38;
  lVar10 = (long)TVar17.deg;
  lVar12 = lVar10 * 0xc + 8;
  for (; lVar10 <= TVar17.deg + iVar9 + -3; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)pBVar3 + lVar12 + -8) =
         *(undefined8 *)((long)pBVar8 + lVar12 + (long)iVar4 * -0xc + -8);
    *(int *)((long)&pBVar3->x + lVar12) = *(int *)((long)&pBVar8[-(long)iVar4].x + lVar12) + iVar4;
    lVar12 = lVar12 + 0xc;
  }
  lVar10 = (long)(TVar17.deg + iVar9 + -2);
  iVar9 = iVar9 * 2 + -4;
  lVar12 = lVar10 * 0xc;
  for (; lVar10 <= iVar15 * 2 + -6; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)&pBVar3->x + lVar12) =
         *(undefined8 *)((long)&pBVar5[-1 - (long)iVar9].x + lVar12);
    *(int *)((long)&pBVar3->n + lVar12) =
         *(int *)((long)pBVar5 + lVar12 + (long)iVar9 * -0xc + -4) + iVar1;
    lVar12 = lVar12 + 0xc;
  }
  iVar6 = iVar15 * 2 + -5;
  iVar9 = pBVar8[(int)uVar7].n;
  iVar15 = pBVar8[iVar9].x;
  iVar1 = pBVar5[pBVar5->n].x;
  iVar2 = pBVar5->x;
  iVar13 = iVar1;
  if (iVar1 < iVar15) {
    iVar13 = iVar15;
  }
  if (iVar13 < iVar2) {
    pBVar3[iVar6].x = iVar13;
    local_38 = (local_38 - iVar2) + iVar13;
  }
  else {
    if (iVar15 < iVar1) {
      iVar1 = iVar15;
    }
    if (iVar2 < iVar1) {
      pBVar3[iVar6].x = iVar1;
      local_38 = (local_38 - iVar1) + iVar2;
    }
    else {
      pBVar3[iVar6].x = iVar2;
    }
  }
  pBVar3[iVar6].y = pBVar5->y;
  pBVar3[iVar6].n = pBVar3[(int)uVar7].n;
  pBVar3[(int)uVar7].n = iVar6;
  iVar4 = iVar4 + iVar9;
  do {
    iVar9 = pBVar3[iVar4].n;
    pBVar3[iVar4].n = iVar6;
    bVar16 = iVar4 != iVar9;
    iVar6 = iVar4;
    iVar4 = iVar9;
  } while (bVar16);
  TVar17.length = local_38;
  TVar17.branch = pBVar3;
  return TVar17;
}

Assistant:

Tree vmergetree(Tree t1, Tree t2)
{
    int i, prev, curr, next, extra, offset1, offset2;
    DTYPE coord1, coord2;
    Tree t;

    t.deg = t1.deg + t2.deg - 1;
    t.length = t1.length + t2.length;
    t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));
    offset1 = t2.deg-1;
    offset2 = 2*t1.deg-3;

    for (i=0; i<=t1.deg-2; i++) {
        t.branch[i].x = t1.branch[i].x;
        t.branch[i].y = t1.branch[i].y;
        t.branch[i].n = t1.branch[i].n + offset1;
    }
    for (i=t1.deg-1; i<=t.deg-1; i++) {
        t.branch[i].x = t2.branch[i-t1.deg+1].x;
        t.branch[i].y = t2.branch[i-t1.deg+1].y;
        t.branch[i].n = t2.branch[i-t1.deg+1].n + offset2;
    }
    for (i=t.deg; i<=t.deg+t1.deg-3; i++) {
        t.branch[i].x = t1.branch[i-offset1].x;
        t.branch[i].y = t1.branch[i-offset1].y;
        t.branch[i].n = t1.branch[i-offset1].n + offset1;
    }
    for (i=t.deg+t1.deg-2; i<=2*t.deg-4; i++) {
        t.branch[i].x = t2.branch[i-offset2].x;
        t.branch[i].y = t2.branch[i-offset2].y;
        t.branch[i].n = t2.branch[i-offset2].n + offset2;
    }
    extra = 2*t.deg-3;
    coord1 = t1.branch[t1.branch[t1.deg-1].n].x;
    coord2 = t2.branch[t2.branch[0].n].x;
    if (t2.branch[0].x > max(coord1, coord2)) {
        t.branch[extra].x = max(coord1, coord2);
        t.length -= t2.branch[0].x - t.branch[extra].x;
    }        
    else if (t2.branch[0].x < min(coord1, coord2)) {
        t.branch[extra].x = min(coord1, coord2);
        t.length -= t.branch[extra].x - t2.branch[0].x;
    }
    else t.branch[extra].x = t2.branch[0].x;
    t.branch[extra].y = t2.branch[0].y;
    t.branch[extra].n = t.branch[t1.deg-1].n;
    t.branch[t1.deg-1].n = extra;

    prev = extra;
    curr = t1.branch[t1.deg-1].n + offset1;
    next = t.branch[curr].n;
    while (curr != next) {
        t.branch[curr].n = prev;
        prev = curr;
        curr = next;
        next = t.branch[curr].n;
    }
    t.branch[curr].n = prev;

    return t;
}